

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

void __thiscall foxxll::request::check_alignment(request *this)

{
  Logger *pLVar1;
  ulong local_4b8;
  Logger local_4b0;
  LoggerVoidify local_331;
  ulong local_330;
  Logger local_328;
  LoggerVoidify local_1a9;
  ulong local_1a8 [3];
  Logger local_190;
  LoggerVoidify local_11;
  request *local_10;
  request *this_local;
  
  local_10 = this;
  if ((this->offset_ & 0xfff) != 0) {
    tlx::Logger::Logger(&local_190);
    pLVar1 = tlx::Logger::operator<<(&local_190,(char (*) [31])"Offset is not aligned: modulo ");
    pLVar1 = tlx::Logger::operator<<(pLVar1,&BlockAlignment);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [4])0x1bc04e);
    local_1a8[0] = (ulong)((uint)this->offset_ & 0xfff);
    pLVar1 = tlx::Logger::operator<<(pLVar1,local_1a8);
    tlx::LoggerVoidify::operator&(&local_11,pLVar1);
    tlx::Logger::~Logger(&local_190);
  }
  if ((this->bytes_ & 0xfff) != 0) {
    tlx::Logger::Logger(&local_328);
    pLVar1 = tlx::Logger::operator<<(&local_328,(char (*) [27])"Size is not a multiple of ");
    pLVar1 = tlx::Logger::operator<<(pLVar1,&BlockAlignment);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [5])", = ");
    local_330 = (ulong)((uint)this->bytes_ & 0xfff);
    pLVar1 = tlx::Logger::operator<<(pLVar1,&local_330);
    tlx::LoggerVoidify::operator&(&local_1a9,pLVar1);
    tlx::Logger::~Logger(&local_328);
  }
  if (((ulong)this->buffer_ & 0xfff) != 0) {
    tlx::Logger::Logger(&local_4b0);
    pLVar1 = tlx::Logger::operator<<(&local_4b0,(char (*) [31])"Buffer is not aligned: modulo ");
    pLVar1 = tlx::Logger::operator<<(pLVar1,&BlockAlignment);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [4])0x1bc04e);
    local_4b8 = (ulong)((uint)this->buffer_ & 0xfff);
    pLVar1 = tlx::Logger::operator<<(pLVar1,&local_4b8);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [3])0x1bd2df);
    pLVar1 = tlx::Logger::operator<<(pLVar1,&this->buffer_);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [2])0x1beb19);
    tlx::LoggerVoidify::operator&(&local_331,pLVar1);
    tlx::Logger::~Logger(&local_4b0);
  }
  return;
}

Assistant:

void request::check_alignment() const
{
    if (offset_ % BlockAlignment != 0)
        TLX_LOG1 << "Offset is not aligned: modulo " <<
            BlockAlignment << " = " << offset_ % BlockAlignment;

    if (bytes_ % BlockAlignment != 0)
        TLX_LOG1 << "Size is not a multiple of " <<
            BlockAlignment << ", = " << bytes_ % BlockAlignment;

    if (size_t(buffer_) % BlockAlignment != 0)
        TLX_LOG1 << "Buffer is not aligned: modulo " <<
            BlockAlignment << " = " << size_t(buffer_) % BlockAlignment <<
            " (" << buffer_ << ")";
}